

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O1

char * ast::operation_to_string(int operation)

{
  if (operation - 0x102U < 0x1a) {
    return &DAT_0012f9ec + *(int *)(&DAT_0012f9ec + (ulong)(operation - 0x102U) * 4);
  }
  return "???";
}

Assistant:

static const char *operation_to_string(int operation)
{
	switch (operation) {
	case ASTERISK:
		return "*";
	case SLASH:
		return "/";
	case PERCENT:
		return "%";
	case PLUS:
		return "+";
	case MINUS:
		return "-";
	case AMPERSAND:
		return "&";
	case CIRCUMFLEX:
		return "^";
	case PIPE:
		return "|";
	case AMPERSAND_AMPERSAND:
		return "&&";
	case PIPE_PIPE:
		return "||";
	case SHIFT_LEFT:
		return "<<";
	case SHIFT_RIGHT:
		return ">>";
	case LESSER:
		return "<";
	case GREATER:
		return ">";
	case LESSER_EQUAL:
		return "<=";
	case GREATER_EQUAL:
		return ">=";
	case EQUAL_EQUAL:
		return "==";
	case NOT_EQUAL:
		return "!=";
	case EQUAL:
		return "=";
	case TILDE:
		return "~";
	case EXCLAMATION:
		return "!";
	default:
		return "???";
	}
}